

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::CMP_IM(CPU *this)

{
  int iVar1;
  byte bVar2;
  
  this->cycles = 2;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  bVar2 = this->A - (byte)iVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | (byte)iVar1 <= this->A | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CMP_IM()
{
    cycles = 2;
    uint8_t op = GetByte();
    uint8_t res = A - op;
    C = (A >= op);
    Z = (A == op);
    N = (res & 0b10000000) > 0;
}